

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Insert(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
         *this,int *key,int *value)

{
  bool bVar1;
  reference this_00;
  memory_resource *pmVar2;
  pair<int,_int> *ppVar3;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_RDI;
  int *in_stack_00000008;
  HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_stack_00000010;
  size_t offset;
  HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  *in_stack_00000060;
  pair<int,_int> *in_stack_ffffffffffffffc8;
  size_type local_20;
  
  local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
  this_00 = pstd::
            vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
            ::operator[](in_RDI,local_20);
  bVar1 = pstd::optional<std::pair<int,_int>_>::has_value(this_00);
  if (!bVar1) {
    pmVar2 = (memory_resource *)((long)&(in_RDI[1].alloc.memoryResource)->_vptr_memory_resource + 1)
    ;
    in_RDI[1].alloc.memoryResource = pmVar2;
    in_stack_ffffffffffffffc8 = (pair<int,_int> *)((long)pmVar2 * 3);
    ppVar3 = (pair<int,_int> *)
             capacity((HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
                       *)0x5a595b);
    if (ppVar3 < in_stack_ffffffffffffffc8) {
      Grow(in_stack_00000060);
      local_20 = FindOffset(in_stack_00000010,in_stack_00000008);
    }
  }
  std::make_pair<int_const&,int_const&>(&in_stack_ffffffffffffffc8->first,(int *)0x5a5996);
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::operator[](in_RDI,local_20);
  pstd::optional<std::pair<int,_int>_>::operator=
            ((optional<std::pair<int,_int>_> *)in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Insert(const Key &key, const Value &value) {
        size_t offset = FindOffset(key);
        if (table[offset].has_value() == false) {
            // Not there already; possibly grow.
            if (3 * ++nStored > capacity()) {
                Grow();
                offset = FindOffset(key);
            }
        }
        table[offset] = std::make_pair(key, value);
    }